

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

Buffer * __thiscall rcg::Stream::grab(Stream *this,int64_t _timeout)

{
  DS_HANDLE pvVar1;
  PDSQueueBuffer p_Var2;
  GC_ERROR GVar3;
  uint uVar4;
  void *pvVar5;
  GenTLException *pGVar6;
  uint64_t uVar7;
  Buffer *this_00;
  allocator local_69;
  string local_68;
  EVENT_NEW_BUFFER_DATA data;
  size_t size;
  
  std::recursive_mutex::lock(&this->mtx);
  uVar7 = 0xffffffffffffffff;
  if (-1 < _timeout) {
    uVar7 = _timeout;
  }
  if ((this->bn != 0) && (this->event != (void *)0x0)) {
    this_00 = &this->buffer;
    pvVar5 = Buffer::getHandle(this_00);
    if (pvVar5 != (void *)0x0) {
      pvVar1 = this->stream;
      p_Var2 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               DSQueueBuffer;
      pvVar5 = Buffer::getHandle(this_00);
      GVar3 = (*p_Var2)(pvVar1,pvVar5);
      if (GVar3 != 0) {
        Buffer::setHandle(this_00,(void *)0x0);
        pGVar6 = (GenTLException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_68,"Stream::grab()",(allocator *)&data);
        GenTLException::GenTLException(pGVar6,&local_68,&this->gentl);
        __cxa_throw(pGVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      Buffer::setHandle(this_00,(void *)0x0);
    }
    size = 0x10;
    data.BufferHandle = (BUFFER_HANDLE)0x0;
    data.pUserPointer = (void *)0x0;
    uVar4 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->EventGetData)(this->event,&data,&size,uVar7);
    if ((uVar4 & 0xfffffffe) == 0xfffffc0c) {
      this_00 = (Buffer *)0x0;
    }
    else {
      if (uVar4 != 0) {
        pGVar6 = (GenTLException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_68,"Stream::grab()",&local_69);
        GenTLException::GenTLException(pGVar6,&local_68,&this->gentl);
        __cxa_throw(pGVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      Buffer::setHandle(this_00,data.BufferHandle);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return this_00;
  }
  pGVar6 = (GenTLException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_68,"Streaming::grab(): Streaming not started",(allocator *)&data);
  GenTLException::GenTLException(pGVar6,&local_68);
  __cxa_throw(pGVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

const Buffer *Stream::grab(int64_t _timeout)
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  uint64_t timeout=GENTL_INFINITE;
  if (_timeout >= 0)
  {
    timeout=static_cast<uint64_t>(_timeout);
  }

  // check that streaming had been started

  if (bn == 0 || event == 0)
  {
    throw GenTLException("Streaming::grab(): Streaming not started");
  }

  // enqueue previously delivered buffer if any

  if (buffer.getHandle() != 0)
  {
    if (gentl->DSQueueBuffer(stream, buffer.getHandle()) != GenTL::GC_ERR_SUCCESS)
    {
      buffer.setHandle(0);
      throw GenTLException("Stream::grab()", gentl);
    }

    buffer.setHandle(0);
  }

  // wait for event

  GenTL::EVENT_NEW_BUFFER_DATA data;
  size_t size=sizeof(GenTL::EVENT_NEW_BUFFER_DATA);
  memset(&data, 0, size);

  GenTL::GC_ERROR err=gentl->EventGetData(event, &data, &size, timeout);

  // return 0 in case of abort and timeout and throw exception in case of
  // another error

  if (err == GenTL::GC_ERR_ABORT || err == GenTL::GC_ERR_TIMEOUT)
  {
    return 0;
  }
  else if (err != GenTL::GC_ERR_SUCCESS)
  {
    throw GenTLException("Stream::grab()", gentl);
  }

  // return buffer

  buffer.setHandle(data.BufferHandle);

  return &buffer;
}